

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::rangeToString<char32_t_const*,char32_t_const*>
          (string *__return_storage_ptr__,Detail *this,char32_t *first,char32_t *last)

{
  Detail *pDVar1;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50 [32];
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  std::operator<<((ostream *)RStack_68.m_oss,"{ ");
  if (this != (Detail *)first) {
    std::__cxx11::string::string
              (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unprintableString_abi_cxx11_);
    std::operator<<((ostream *)RStack_68.m_oss,local_50);
    std::__cxx11::string::~string(local_50);
    for (pDVar1 = this + 4; pDVar1 != (Detail *)first; pDVar1 = pDVar1 + 4) {
      std::operator<<((ostream *)RStack_68.m_oss,", ");
      std::__cxx11::string::string
                (local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unprintableString_abi_cxx11_);
      std::operator<<((ostream *)RStack_68.m_oss,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  std::operator<<((ostream *)RStack_68.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&RStack_68);
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }